

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_Locale::SetCurrentCulture(ON_Locale *current_culture_locale)

{
  bool bVar1;
  char *local_a8;
  char *s;
  size_t buffer_capacity;
  char buffer [128];
  ON_Locale *current_culture_locale_local;
  
  memcpy(&m_CurrentCulture,current_culture_locale,0x9c);
  memset(&buffer_capacity,0,0x80);
  local_a8 = (char *)0x0;
  bVar1 = IsOrdinalOrInvariantCulture(current_culture_locale);
  if (!bVar1) {
    local_a8 = GetBCP47LanguageTag(current_culture_locale,(char *)&buffer_capacity,0x80);
  }
  if ((local_a8 == (char *)0x0) || (*local_a8 == '\0')) {
    setlocale(6,"C");
  }
  else {
    setlocale(6,local_a8);
  }
  setlocale(1,"C");
  return true;
}

Assistant:

bool ON_Locale::SetCurrentCulture(
  const ON_Locale& current_culture_locale
  )
{
  ON_Locale::m_CurrentCulture = current_culture_locale;

  char buffer[ON_Locale::BUFFER_MAXIMUM_CAPACITY] = { 0 };
  size_t buffer_capacity = sizeof(buffer) / sizeof(buffer[0]);
  const char* s = nullptr;

  if (false == current_culture_locale.IsOrdinalOrInvariantCulture())
  {
#if defined(ON_RUNTIME_WIN)
    // Windows sometimes appends _<sortorder>
    s = current_culture_locale.GetWindowsLocaleName(buffer,buffer_capacity);
#elif defined(ON_RUNTIME_APPLE)
    // Apple puts an _ before <REGION>
    s = current_culture_locale.GetAppleLocaleName(buffer,buffer_capacity);
#else
    // The current "standard" ?
    s = current_culture_locale.GetBCP47LanguageTag(buffer, buffer_capacity);
#endif
  }

  // String collate and mapping functions should use the locale for the name.
  if ( nullptr == s || 0 == s[0] )
  {
    setlocale(LC_ALL,"C");
  }
  else
  {
    setlocale(LC_ALL,s);
  }

  // number parsing and formatting use a decimal point in all cases.
  setlocale(LC_NUMERIC,"C");

  return true;
}